

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O1

cfg_entry *
cfg_db_set_entry_ext
          (cfg_db *db,char *section_type,char *section_name,char *entry_name,char *value,
          _Bool append,_Bool front)

{
  bool bVar1;
  int iVar2;
  ulong in_RAX;
  cfg_named_section *named;
  cfg_entry *entry;
  char *pcVar3;
  _Bool new_section;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  named = _cfg_db_add_section(db,section_type,section_name,(_Bool *)((long)&uStack_38 + 7));
  if (named == (cfg_named_section *)0x0) {
    return (cfg_entry *)0x0;
  }
  entry = (cfg_entry *)avl_find(&named->entries,entry_name);
  if (entry == (cfg_entry *)0x0) {
    if (entry_name == (char *)0x0) {
      __assert_fail("name",
                    "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/libconfig/cfg_db.c"
                    ,0x23c,
                    "struct cfg_entry *_alloc_entry(struct cfg_named_section *, const char *)");
    }
    entry = (cfg_entry *)calloc(1,0x58);
    if (entry == (cfg_entry *)0x0) {
LAB_00128a87:
      entry = (cfg_entry *)0x0;
    }
    else {
      pcVar3 = strdup(entry_name);
      entry->name = pcVar3;
      if (pcVar3 == (char *)0x0) {
        free(entry);
        goto LAB_00128a87;
      }
      (entry->node).key = pcVar3;
      avl_insert(&named->entries,(avl_node *)entry);
      entry->named_section = named;
    }
    bVar1 = true;
    if (entry == (cfg_entry *)0x0) {
      entry = (cfg_entry *)0x0;
      bVar1 = false;
      goto LAB_00128ad1;
    }
  }
  else {
    bVar1 = false;
  }
  if (!append) {
    free((entry->val).value);
    (entry->val).value = (char *)0x0;
    (entry->val).length = 0;
  }
  if (front) {
    iVar2 = strarray_prepend(&entry->val,value);
  }
  else {
    iVar2 = strarray_append(&entry->val,value);
  }
  if (iVar2 == 0) {
    return entry;
  }
LAB_00128ad1:
  if (bVar1) {
    _free_entry(entry);
  }
  if (uStack_38._7_1_ == '\x01') {
    _free_namedsection(named);
  }
  return (cfg_entry *)0x0;
}

Assistant:

struct cfg_entry *
cfg_db_set_entry_ext(struct cfg_db *db, const char *section_type, const char *section_name, const char *entry_name,
  const char *value, bool append, bool front) {
  struct cfg_entry *entry;
  struct cfg_named_section *named;
  bool new_section = false, new_entry = NULL;

  /* create section */
  named = _cfg_db_add_section(db, section_type, section_name, &new_section);
  if (!named) {
    return NULL;
  }

  /* get entry */
  entry = avl_find_element(&named->entries, entry_name, entry, node);
  if (!entry) {
    entry = _alloc_entry(named, entry_name);
    if (!entry) {
      goto set_entry_error;
    }
    new_entry = true;
  }

  if (!append) {
    strarray_free(&entry->val);
  }
  /* prepend new entry */
  if (front) {
    if (strarray_prepend(&entry->val, value)) {
      goto set_entry_error;
    }
  }
  else {
    if (strarray_append(&entry->val, value)) {
      goto set_entry_error;
    }
  }

  return entry;
set_entry_error:
  if (new_entry) {
    _free_entry(entry);
  }
  if (new_section) {
    _free_namedsection(named);
  }
  return NULL;
}